

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

GetElementPtrInst *
GetElementPtrInst::create_gep
          (Value *ptr,vector<Value_*,_std::allocator<Value_*>_> *idxs,BasicBlock *bb)

{
  GetElementPtrInst *this;
  vector<Value_*,_std::allocator<Value_*>_> local_38;
  
  this = (GetElementPtrInst *)operator_new(0x90);
  std::vector<Value_*,_std::allocator<Value_*>_>::vector(&local_38,idxs);
  GetElementPtrInst(this,ptr,&local_38,bb);
  if (local_38.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

GetElementPtrInst *GetElementPtrInst::create_gep(Value *ptr, std::vector<Value *> idxs, BasicBlock *bb)
{
    return new GetElementPtrInst(ptr, idxs, bb);
}